

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O2

fdb_compact_decision
compaction_cb(fdb_file_handle *fhandle,fdb_compaction_status status,char *kv_name,fdb_doc *doc,
             uint64_t old_offset,uint64_t new_offset,void *ctx)

{
  fdb_status fVar1;
  int iVar2;
  byte bVar3;
  uint __line;
  char *pcVar4;
  fdb_doc *rdoc;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  if (status == 0x10) {
    *(undefined1 *)((long)ctx + 9) = 1;
  }
  else {
    if (status == 2) {
      bVar3 = doc->deleted;
      *(int *)ctx = *ctx + 1;
      fdb_doc_create(&rdoc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
      rdoc->offset = old_offset;
      fVar1 = fdb_get_byoffset(*(fdb_kvs_handle **)((long)ctx + 0x10),rdoc);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_doc_free(rdoc);
        if ((fhandle->root->config).multi_kv_instances == true) {
          if (*(short *)kv_name == 0x6264) goto LAB_00104aee;
          pcVar4 = "db";
          __line = 0x56;
        }
        else {
          iVar2 = bcmp(kv_name,"default",7);
          if (iVar2 == 0) goto LAB_00104aee;
          pcVar4 = "default";
          __line = 0x58;
        }
        fprintf(_stderr,"Test expected %s but got %s failed: %s %d\n",pcVar4,kv_name,
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                ,(ulong)__line);
        pcVar4 = "false";
        goto LAB_00104bb0;
      }
      __line = 0x52;
LAB_00104b92:
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,(ulong)__line);
      pcVar4 = "s == FDB_RESULT_SUCCESS";
LAB_00104bb0:
      __assert_fail(pcVar4,
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,__line,
                    "fdb_compact_decision compaction_cb(fdb_file_handle *, fdb_compaction_status, const char *, fdb_doc *, uint64_t, uint64_t, void *)"
                   );
    }
    if (status == 8) {
      *(undefined1 *)((long)ctx + 10) = 1;
    }
    else if (status == 1) {
      *(undefined1 *)((long)ctx + 8) = 1;
    }
    else {
      *(int *)((long)ctx + 4) = *(int *)((long)ctx + 4) + 1;
      fdb_doc_create(&rdoc,(void *)0x0,0,(void *)0x0,0,(void *)0x0,0);
      rdoc->offset = old_offset;
      fVar1 = fdb_get_byoffset(*(fdb_kvs_handle **)((long)ctx + 0x10),rdoc);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        __line = 0x5f;
        goto LAB_00104b92;
      }
      fdb_doc_free(rdoc);
    }
  }
  bVar3 = 0;
LAB_00104aee:
  return (fdb_compact_decision)bVar3;
}

Assistant:

static fdb_compact_decision compaction_cb(fdb_file_handle *fhandle,
                            fdb_compaction_status status, const char *kv_name,
                            fdb_doc *doc, uint64_t old_offset,
                            uint64_t new_offset,
                            void *ctx)
{
    TEST_INIT();
    fdb_doc *rdoc;
    fdb_status s;
    fdb_compact_decision ret = FDB_CS_KEEP_DOC;
    struct cb_args *args = (struct cb_args *)ctx;

    (void) doc;
    (void) new_offset;

    if (status == FDB_CS_BEGIN) {
        args->begin = true;
    } else if (status == FDB_CS_END) {
        args->end = true;
    } else if (status == FDB_CS_FLUSH_WAL) {
        args->wal_flush = true;
    } else if (status == FDB_CS_MOVE_DOC) {
        if (doc->deleted) {
            ret = FDB_CS_DROP_DOC;
        }

        args->n_moved_docs++;
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->offset = old_offset;
        s = fdb_get_byoffset(args->handle, rdoc);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);

        if (fhandle->root->config.multi_kv_instances) {
            TEST_CMP(kv_name, "db", 2);
        } else {
            TEST_CMP(kv_name, "default", 7);
        }
    } else { // FDB_CS_BATCH_MOVE
        args->n_batch_move++;
        fdb_doc_create(&rdoc, NULL, 0, NULL, 0, NULL, 0);
        rdoc->offset = old_offset;
        s = fdb_get_byoffset(args->handle, rdoc);
        TEST_CHK (s == FDB_RESULT_SUCCESS);
        fdb_doc_free(rdoc);
    }
    return ret;
}